

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.c
# Opt level: O1

m2v * m2v_get_subview(m2v *__return_storage_ptr__,m2v *M,int row_offs,int col_offs,int n_row,
                     int n_col)

{
  int iVar1;
  
  __return_storage_ptr__->n_row = n_row;
  __return_storage_ptr__->n_col = M->n_col;
  iVar1 = M->row_stride;
  __return_storage_ptr__->row_stride = iVar1;
  __return_storage_ptr__->e = M->e + row_offs * iVar1;
  return __return_storage_ptr__;
}

Assistant:

m2v m2v_get_subview(m2v* M, int row_offs, int col_offs, int n_row, int n_col)
{
	assert(0 <= row_offs);
	assert(0 == col_offs);
	assert(0 <= n_row);
	assert(M->n_col == n_col);
	assert(row_offs + n_row <= M->n_row);

	m2v subv;
	subv.n_row = n_row;
	subv.n_col = M->n_col;
	subv.row_stride = M->row_stride;
	subv.e = M->e + row_offs*M->row_stride;

	return subv;
}